

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mailbox.cpp
# Opt level: O0

void __thiscall zmq::mailbox_t::~mailbox_t(mailbox_t *this)

{
  ypipe_t<zmq::command_t,_16> *in_RDI;
  
  mutex_t::lock((mutex_t *)in_RDI);
  mutex_t::unlock((mutex_t *)in_RDI);
  mutex_t::~mutex_t((mutex_t *)this);
  signaler_t::~signaler_t((signaler_t *)this);
  ypipe_t<zmq::command_t,_16>::~ypipe_t(in_RDI);
  i_mailbox::~i_mailbox((i_mailbox *)in_RDI);
  return;
}

Assistant:

zmq::mailbox_t::~mailbox_t ()
{
    //  TODO: Retrieve and deallocate commands inside the _cpipe.

    // Work around problem that other threads might still be in our
    // send() method, by waiting on the mutex before disappearing.
    _sync.lock ();
    _sync.unlock ();
}